

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make.cc
# Opt level: O0

void __thiscall GNUmakeTokenPool::Clear(GNUmakeTokenPool *this)

{
  GNUmakeTokenPool *this_local;
  
  while (0 < this->used_) {
    (*(this->super_TokenPool)._vptr_TokenPool[4])();
  }
  while (1 < this->available_) {
    Return(this);
  }
  return;
}

Assistant:

void GNUmakeTokenPool::Clear() {
  while (used_ > 0)
    Release();
  while (available_ > 1)
    Return();
}